

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O2

wchar_t assertion_is_symlink(char *file,wchar_t line,char *path,char *contents,wchar_t isdir)

{
  wchar_t wVar1;
  
  wVar1 = is_symlink(file,line,path,contents,isdir);
  if (wVar1 == L'\0') {
    if (contents == (char *)0x0) {
      failure_start(file,line,"File %s is not a symlink",path);
    }
    else {
      failure_start(file,line,"File %s is not a symlink to %s",path,contents);
    }
    wVar1 = L'\0';
    failure_finish((void *)0x0);
  }
  else {
    wVar1 = L'\x01';
  }
  return wVar1;
}

Assistant:

int
assertion_is_symlink(const char *file, int line,
    const char *path, const char *contents, int isdir)
{
	if (is_symlink(file, line, path, contents, isdir))
		return (1);
	if (contents)
		failure_start(file, line, "File %s is not a symlink to %s",
		    path, contents);
	else
		failure_start(file, line, "File %s is not a symlink", path);
	failure_finish(NULL);
	return (0);
}